

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

int __thiscall EncodingTable::searchStringMatch(EncodingTable *this,wstring *str,size_t pos)

{
  int iVar1;
  bool bVar2;
  TableEntry *pTVar3;
  reference pvVar4;
  ulong uVar5;
  int *piVar6;
  ulong local_50;
  size_t k;
  bool match;
  TableEntry *entry;
  size_t i;
  size_t sStack_28;
  int longestNum;
  size_t longestLength;
  size_t pos_local;
  wstring *str_local;
  EncodingTable *this_local;
  
  sStack_28 = 0;
  i._4_4_ = -1;
  entry = (TableEntry *)0x0;
  do {
    pTVar3 = (TableEntry *)
             std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::
             size(&this->entries);
    if (pTVar3 <= entry) {
      return i._4_4_;
    }
    pvVar4 = std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::
             operator[](&this->entries,(size_type)entry);
    if (sStack_28 <= pvVar4->valueLen) {
      bVar2 = true;
      for (local_50 = 0; local_50 < pvVar4->valueLen; local_50 = local_50 + 1) {
        uVar5 = std::__cxx11::wstring::size();
        if (uVar5 <= pos + local_50) {
LAB_001671e4:
          bVar2 = false;
          break;
        }
        piVar6 = (int *)std::__cxx11::wstring::operator[]((ulong)&this->valueData);
        iVar1 = *piVar6;
        piVar6 = (int *)std::__cxx11::wstring::operator[]((ulong)str);
        if (iVar1 != *piVar6) goto LAB_001671e4;
      }
      if (bVar2) {
        sStack_28 = pvVar4->valueLen;
        i._4_4_ = (int)entry;
      }
    }
    entry = (TableEntry *)((long)&entry->hexPos + 1);
  } while( true );
}

Assistant:

int EncodingTable::searchStringMatch(const std::wstring& str, size_t pos)
{
	size_t longestLength = 0;
	int longestNum = -1;

	for (size_t i = 0; i < entries.size(); i++)
	{
		TableEntry& entry = entries[i];
		if (entry.valueLen < longestLength) continue;

		bool match = true;
		for (size_t k = 0; k < entry.valueLen; k++)
		{
			if (pos+k >= str.size() || valueData[entry.valuePos+k] != str[pos+k])
			{
				match = false;
				break;
			}
		}

		if (match)
		{
			longestLength = entry.valueLen;
			longestNum = (int) i;
		}
	}

	return longestNum;
}